

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

short duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<unsigned_short,short>
                (unsigned_short input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  string local_40;
  
  if ((short)input < 0) {
    CastExceptionText<unsigned_short,short>(&local_40,(duckdb *)(ulong)input,(unsigned_short)idx);
    input = HandleVectorCastError::Operation<short>(&local_40,mask,idx,(VectorTryCastData *)dataptr)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return input;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}